

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextAnalyzer.cpp
# Opt level: O2

unsigned_long TextAnalyzer::findOperator(string *toSeparate,short *opLen)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  char cVar2;
  unsigned_long uVar3;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  unsigned_long local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmpVec1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmpVec2;
  
  *opLen = 2;
  local_98 = std::__cxx11::string::find((char *)toSeparate,0x11d691);
  local_90 = std::__cxx11::string::find((char *)toSeparate,0x11d694);
  local_88 = std::__cxx11::string::find((char *)toSeparate,0x11d68e);
  local_80 = std::__cxx11::string::find((char *)toSeparate,0x11d68b);
  local_78 = std::__cxx11::string::find((char *)toSeparate,0x11d694);
  __l._M_len = 5;
  __l._M_array = &local_98;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,__l,
             (allocator_type *)
             &tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  _Var1 = std::
          __min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_60,tmpVec1.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  uVar3 = *_Var1._M_current;
  if (uVar3 == 0xffffffffffffffff) {
    cVar2 = (char)toSeparate;
    local_98 = std::__cxx11::string::find(cVar2,0x3d);
    local_90 = std::__cxx11::string::find(cVar2,0x3c);
    local_88 = std::__cxx11::string::find(cVar2,0x3e);
    local_80 = std::__cxx11::string::find(cVar2,0x7b);
    local_78 = std::__cxx11::string::find(cVar2,0x7d);
    local_70 = std::__cxx11::string::find(cVar2,0x28);
    local_68 = std::__cxx11::string::find(cVar2,0x29);
    __l_00._M_len = 7;
    __l_00._M_array = &local_98;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__l_00,
               (allocator_type *)
               ((long)&tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    _Var1 = std::
            __min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    uVar3 = *_Var1._M_current;
    *opLen = 1;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_60);
  return uVar3;
}

Assistant:

unsigned long TextAnalyzer::findOperator(string &toSeparate, short &opLen) {
    opLen = 2;
    vector<unsigned long> tmpVec1 = {toSeparate.find("=="), toSeparate.find("!="), toSeparate.find(">="), toSeparate
            .find("<="), toSeparate.find("!=")};
    auto it1 = min_element(tmpVec1.begin(), tmpVec1.end());
    unsigned long index = *(it1);
    if (index == string::npos) {// ==,!=,>=,<=,!= wasn't found - search =,<,>
        vector<unsigned long> tmpVec2 = {toSeparate.find('='), toSeparate.find('<'), toSeparate.find('>'), toSeparate
                .find('{'), toSeparate.find('}'), toSeparate.find('('), toSeparate.find(')')};
        auto it2 = min_element(tmpVec2.begin(), tmpVec2.end());
        index = *(it2);
        opLen = 1;
    }
    return index;
}